

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

int tag_label(mdl_t *mdl,FILE *fin,FILE *fout)

{
  uint64_t uVar1;
  uint64_t uVar2;
  byte bVar3;
  byte bVar4;
  rdr_t *rdr;
  uint64_t *puVar5;
  long lVar6;
  double *pdVar7;
  double *out_00;
  uint32_t N_00;
  qrk_t *pqVar8;
  FILE *pFVar9;
  int iVar10;
  seq_t *psVar11;
  double *sc;
  ulong uVar12;
  char *pcVar13;
  uint64_t *puVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ulong auStack_120 [2];
  uint64_t *local_110 [2];
  double F1;
  double Pr;
  double Rc;
  char *lbl_1;
  char *pcStack_e0;
  uint32_t y_1;
  double se_1;
  double te_1;
  double se;
  double te;
  uint32_t t_1;
  _Bool err;
  char *lblstr;
  uint local_a8;
  uint32_t lbl;
  uint32_t t;
  uint32_t n;
  double *scs;
  double *psc;
  uint32_t *out;
  uint32_t T;
  seq_t *seq;
  raw_t *raw;
  ulong uStack_68;
  uint32_t y;
  unsigned_long __vla_expr0;
  long local_58;
  uint64_t serr;
  uint64_t scnt;
  uint64_t terr;
  uint64_t tcnt;
  uint32_t N;
  uint32_t Y;
  qrk_t *lbls;
  FILE *fout_local;
  FILE *fin_local;
  mdl_t *mdl_local;
  
  __vla_expr0 = (unsigned_long)(auStack_120 + 1);
  _N = mdl->reader->lbl;
  tcnt._4_4_ = mdl->nlbl;
  tcnt._0_4_ = mdl->opt->nbest;
  terr = 0;
  scnt = 0;
  serr = 0;
  local_58 = 0;
  auStack_120[1] = (ulong)tcnt._4_4_;
  lVar6 = -(auStack_120[1] * 0x18 + 0xf & 0xfffffffffffffff0);
  puVar14 = (uint64_t *)((long)local_110 + lVar6 + -8);
  for (raw._4_4_ = 0; local_110[0] = puVar14, uStack_68 = auStack_120[1], lbls = (qrk_t *)fout,
      fout_local = fin, fin_local = (FILE *)mdl, raw._4_4_ < tcnt._4_4_; raw._4_4_ = raw._4_4_ + 1)
  {
    puVar14[auStack_120[1] * 2 + (ulong)raw._4_4_] = 0;
    puVar14[auStack_120[1] + raw._4_4_] = 0;
    puVar14[raw._4_4_] = 0;
  }
  while( true ) {
    pFVar9 = fout_local;
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108a56;
    iVar10 = feof((FILE *)pFVar9);
    if (iVar10 != 0) break;
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108a78;
    psVar11 = (seq_t *)rdr_readraw(*(rdr_t **)((long)&Pr + lVar6),*(FILE **)((long)&F1 + lVar6));
    seq = psVar11;
    if (psVar11 == (seq_t *)0x0) break;
    rdr = (rdr_t *)fin_local->_IO_backup_base;
    bVar3 = *(byte *)(*(long *)fin_local + 0xd9);
    bVar4 = *(byte *)(*(long *)fin_local + 0xe0);
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108acc;
    _T = rdr_raw2seq(rdr,(raw_t *)psVar11,(bVar3 & 1) != 0 || (bVar4 & 1) != 0);
    if (_T == (seq_t *)0x0) {
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x108ae0;
      rdr_freeraw(*(raw_t **)((long)local_110 + lVar6));
      return 0;
    }
    out._0_4_ = _T->len;
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108b11;
    psc = (double *)xmalloc(*(size_t *)((long)local_110 + lVar6));
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108b2d;
    scs = (double *)xmalloc(*(size_t *)((long)local_110 + lVar6));
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108b42;
    sc = (double *)xmalloc(*(size_t *)((long)local_110 + lVar6));
    pFVar9 = fin_local;
    N_00 = (uint32_t)tcnt;
    psVar11 = _T;
    out_00 = psc;
    pdVar7 = scs;
    _t = sc;
    if ((uint32_t)tcnt == 1) {
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x108b71;
      tag_viterbi(*(mdl_t **)((long)&__vla_expr0 + lVar6),
                  *(seq_t **)((long)&stack0xffffffffffffff98 + lVar6),
                  *(uint32_t **)((long)&raw + lVar6),*(double **)((long)&seq + lVar6),
                  *(double **)((long)&T + lVar6));
    }
    else {
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x108b98;
      tag_nbviterbi((mdl_t *)pFVar9,psVar11,N_00,(uint32_t **)out_00,sc,(double **)pdVar7);
    }
    for (lbl = 0; pqVar8 = lbls, lbl < (uint32_t)tcnt; lbl = lbl + 1) {
      if ((*(byte *)(*(long *)fin_local + 0xda) & 1) != 0) {
        uVar12 = (ulong)lbl;
        dVar15 = _t[lbl];
        *(undefined8 *)((long)auStack_120 + lVar6) = 0x108beb;
        fprintf((FILE *)pqVar8,"# %d %f\n",dVar15,uVar12);
      }
      for (local_a8 = 0; pqVar8 = lbls, local_a8 < (uint)out; local_a8 = local_a8 + 1) {
        if ((*(byte *)(*(long *)fin_local + 0xd8) & 1) == 0) {
          puVar5 = (&seq->raw)[local_a8];
          *(undefined8 *)((long)auStack_120 + lVar6) = 0x108c35;
          fprintf((FILE *)pqVar8,"%s\t",puVar5);
        }
        lblstr._4_4_ = *(undefined4 *)((long)psc + (ulong)(local_a8 * (uint32_t)tcnt + lbl) * 4);
        *(undefined8 *)((long)auStack_120 + lVar6) = 0x108c68;
        pcVar13 = qrk_id2str(*(qrk_t **)((long)local_110 + lVar6),*puVar14);
        pqVar8 = lbls;
        _t_1 = pcVar13;
        *(undefined8 *)((long)auStack_120 + lVar6) = 0x108c88;
        fprintf((FILE *)pqVar8,"%s",pcVar13);
        pqVar8 = lbls;
        pcVar13 = _t_1;
        if ((*(byte *)(*(long *)fin_local + 0xda) & 1) != 0) {
          *(undefined8 *)((long)auStack_120 + lVar6) = 0x108cb1;
          fprintf((FILE *)pqVar8,"\t%s",pcVar13);
          pqVar8 = lbls;
          dVar15 = scs[local_a8 * (uint32_t)tcnt + lbl];
          *(undefined8 *)((long)auStack_120 + lVar6) = 0x108ce1;
          fprintf((FILE *)pqVar8,"/%f",dVar15);
        }
        pqVar8 = lbls;
        *(undefined8 *)((long)auStack_120 + lVar6) = 0x108cf3;
        fprintf((FILE *)pqVar8,"\n");
      }
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x108d19;
      fprintf((FILE *)pqVar8,"\n");
    }
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108d36;
    fflush((FILE *)pqVar8);
    pdVar7 = _t;
    if ((*(byte *)(*(long *)fin_local + 0xd9) & 1) != 0) {
      te._7_1_ = 0;
      for (te._0_4_ = 0; te._0_4_ < (uint)out; te._0_4_ = te._0_4_ + 1) {
        if (_T[(ulong)te._0_4_ * 2 + 1].len != 0xffffffff) {
          local_110[0][_T[(ulong)te._0_4_ * 2 + 1].len] =
               local_110[0][_T[(ulong)te._0_4_ * 2 + 1].len] + 1;
          uVar12 = (ulong)*(uint *)((long)psc + (ulong)(te._0_4_ * (uint32_t)tcnt) * 4);
          local_110[0][auStack_120[1] + uVar12] = local_110[0][auStack_120[1] + uVar12] + 1;
          if (_T[(ulong)te._0_4_ * 2 + 1].len ==
              *(uint32_t *)((long)psc + (ulong)(te._0_4_ * (uint32_t)tcnt) * 4)) {
            uVar12 = (ulong)*(uint *)((long)psc + (ulong)(te._0_4_ * (uint32_t)tcnt) * 4);
            local_110[0][auStack_120[1] * 2 + uVar12] =
                 local_110[0][auStack_120[1] * 2 + uVar12] + 1;
          }
          else {
            scnt = scnt + 1;
            te._7_1_ = 1;
          }
        }
      }
      terr = (uint)out + terr;
      local_58 = (ulong)te._7_1_ + local_58;
    }
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108eb3;
    free(pdVar7);
    pdVar7 = scs;
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108ebf;
    free(pdVar7);
    pdVar7 = psc;
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108ecb;
    free(pdVar7);
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108ed4;
    rdr_freeseq(*(seq_t **)((long)auStack_120 + lVar6));
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x108edd;
    rdr_freeraw(*(raw_t **)((long)local_110 + lVar6));
    uVar12 = serr + 1;
    serr = uVar12;
    if (uVar12 % 1000 == 0) {
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x108f0f;
      info("%10lu sequences labeled",uVar12);
      if ((*(byte *)(*(long *)fin_local + 0xd9) & 1) != 0) {
        auVar16._8_4_ = (int)(scnt >> 0x20);
        auVar16._0_8_ = scnt;
        auVar16._12_4_ = 0x45300000;
        auVar22._8_4_ = (int)(terr >> 0x20);
        auVar22._0_8_ = terr;
        auVar22._12_4_ = 0x45300000;
        pcVar13 = (char *)((((auVar16._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)scnt) - 4503599627370496.0)) /
                           ((auVar22._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)terr) - 4503599627370496.0))) * 100.0);
        se = (double)pcVar13;
        auVar17._8_4_ = (int)((ulong)local_58 >> 0x20);
        auVar17._0_8_ = local_58;
        auVar17._12_4_ = 0x45300000;
        auVar23._8_4_ = (int)(serr >> 0x20);
        auVar23._0_8_ = serr;
        auVar23._12_4_ = 0x45300000;
        dVar15 = (((auVar17._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_58) - 4503599627370496.0)) /
                 ((auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)serr) - 4503599627370496.0))) * 100.0;
        te_1 = dVar15;
        *(undefined8 *)((long)auStack_120 + lVar6) = 0x108fe0;
        info(pcVar13,dVar15,"\t%5.2f%%/%5.2f%%");
      }
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x108fee;
      info("\n");
    }
  }
  uVar1 = serr;
  if ((*(byte *)(*(long *)fin_local + 0xd9) & 1) != 0) {
    auVar18._8_4_ = (int)(scnt >> 0x20);
    auVar18._0_8_ = scnt;
    auVar18._12_4_ = 0x45300000;
    auVar24._8_4_ = (int)(terr >> 0x20);
    auVar24._0_8_ = terr;
    auVar24._12_4_ = 0x45300000;
    se_1 = (((auVar18._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)scnt) - 4503599627370496.0)) /
           ((auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)terr) - 4503599627370496.0))) * 100.0;
    auVar19._8_4_ = (int)((ulong)local_58 >> 0x20);
    auVar19._0_8_ = local_58;
    auVar19._12_4_ = 0x45300000;
    auVar25._8_4_ = (int)(serr >> 0x20);
    auVar25._0_8_ = serr;
    auVar25._12_4_ = 0x45300000;
    pcStack_e0 = (char *)((((auVar19._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_58) - 4503599627370496.0)) /
                          ((auVar25._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)serr) - 4503599627370496.0))) * 100.0);
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x1090b8;
    info("    Nb sequences  : %lu\n",uVar1);
    dVar15 = se_1;
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x1090ce;
    info((char *)dVar15,"    Token error   : %5.2f%%\n");
    pcVar13 = pcStack_e0;
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x1090e4;
    info(pcVar13,"    Sequence error: %5.2f%%\n");
    *(undefined8 *)((long)auStack_120 + lVar6) = 0x1090f2;
    info("* Per label statistics\n");
    for (lbl_1._4_4_ = 0; lbl_1._4_4_ < tcnt._4_4_; lbl_1._4_4_ = lbl_1._4_4_ + 1) {
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x10911c;
      pcVar13 = qrk_id2str(*(qrk_t **)((long)local_110 + lVar6),*puVar14);
      Rc = (double)pcVar13;
      uVar1 = local_110[0][auStack_120[1] * 2 + (ulong)lbl_1._4_4_];
      auVar20._8_4_ = (int)(uVar1 >> 0x20);
      auVar20._0_8_ = uVar1;
      auVar20._12_4_ = 0x45300000;
      uVar2 = local_110[0][lbl_1._4_4_];
      auVar26._8_4_ = (int)(uVar2 >> 0x20);
      auVar26._0_8_ = uVar2;
      auVar26._12_4_ = 0x45300000;
      Pr = ((auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
           ((auVar26._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
      uVar1 = local_110[0][auStack_120[1] * 2 + (ulong)lbl_1._4_4_];
      auVar21._8_4_ = (int)(uVar1 >> 0x20);
      auVar21._0_8_ = uVar1;
      auVar21._12_4_ = 0x45300000;
      uVar2 = local_110[0][auStack_120[1] + lbl_1._4_4_];
      auVar27._8_4_ = (int)(uVar2 >> 0x20);
      auVar27._0_8_ = uVar2;
      auVar27._12_4_ = 0x45300000;
      F1 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
           ((auVar27._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
      local_110[1] = (uint64_t *)((F1 * Pr * 2.0) / (F1 + Pr));
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x109225;
      info("    %-6s",pcVar13);
      dVar15 = F1;
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x10923b;
      info((char *)dVar15,"  Pr=%.2f");
      dVar15 = Pr;
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x109251;
      info((char *)dVar15,"  Rc=%.2f");
      puVar5 = local_110[1];
      *(undefined8 *)((long)auStack_120 + lVar6) = 0x109267;
      info((char *)puVar5,"  F1=%.2f\n");
    }
  }
  return 1;
}

Assistant:

int tag_label(mdl_t *mdl, FILE *fin, FILE *fout) {
	qrk_t *lbls = mdl->reader->lbl;
	const uint32_t Y = mdl->nlbl;
	const uint32_t N = mdl->opt->nbest;
	// We start by preparing the statistic collection to be ready if check
	// option is used. The stat array hold the following for each label
	//   [0] # of reference with this label
	//   [1] # of token we have taged with this label
	//   [2] # of match of the two preceding
	uint64_t tcnt = 0, terr = 0;
	uint64_t scnt = 0, serr = 0;
	uint64_t stat[3][Y];
	for (uint32_t y = 0; y < Y; y++)
		stat[0][y] = stat[1][y] = stat[2][y] = 0;
	// Next read the input file sequence by sequence and label them, we have
	// to take care of not discarding the raw input as we want to send it
	// back to the output with the additional predicted labels.
	while (!feof(fin)) {
		// So, first read an input sequence keeping the raw_t object
		// available, and label it with Viterbi.
		raw_t *raw = rdr_readraw(mdl->reader, fin);
		if (raw == NULL)
			break;
		seq_t *seq = rdr_raw2seq(mdl->reader, raw,
			mdl->opt->check | mdl->opt->force);
        if (seq == NULL) {
            rdr_freeraw(raw);
            return 0;
        }
		const uint32_t T = seq->len;
		uint32_t *out = xmalloc(sizeof(uint32_t) * T * N);
		double   *psc = xmalloc(sizeof(double  ) * T * N);
		double   *scs = xmalloc(sizeof(double  ) * N);
		if (N == 1)
			tag_viterbi(mdl, seq, (uint32_t*)out, scs, (double*)psc);
		else
			tag_nbviterbi(mdl, seq, N, (void*)out, scs, (void*)psc);
		// Next we output the raw sequence with an aditional column for
		// the predicted labels
		for (uint32_t n = 0; n < N; n++) {
			if (mdl->opt->outsc)
				fprintf(fout, "# %d %f\n", (int)n, scs[n]);
			for (uint32_t t = 0; t < T; t++) {
				if (!mdl->opt->label)
					fprintf(fout, "%s\t", raw->lines[t]);
				uint32_t lbl = out[t * N + n];
				const char *lblstr = qrk_id2str(lbls, lbl);
				fprintf(fout, "%s", lblstr);
				if (mdl->opt->outsc) {
					fprintf(fout, "\t%s", lblstr);
					fprintf(fout, "/%f", psc[t * N + n]);
				}
				fprintf(fout, "\n");
			}
			fprintf(fout, "\n");
		}
		fflush(fout);
		// If user provided reference labels, use them to collect
		// statistics about how well we have performed here. Labels
		// unseen at training time are discarded.
		if (mdl->opt->check) {
			bool err = false;
			for (uint32_t t = 0; t < T; t++) {
				if (seq->pos[t].lbl == (uint32_t)-1)
					continue;
				stat[0][seq->pos[t].lbl]++;
				stat[1][out[t * N]]++;
				if (seq->pos[t].lbl != out[t * N])
					terr++, err = true;
				else
					stat[2][out[t * N]]++;
			}
			tcnt += T;
			serr += err;
		}
		// Cleanup memory used for this sequence
		free(scs);
		free(psc);
		free(out);
		rdr_freeseq(seq);
		rdr_freeraw(raw);
		// And report our progress, at regular interval we display how
		// much sequence are labelled and if possible the current tokens
		// and sequence error rates.
		if (++scnt % 1000 == 0) {
			info("%10"PRIu64" sequences labeled", scnt);
			if (mdl->opt->check) {
				const double te = (double)terr  / tcnt * 100.0;
				const double se = (double)serr  / scnt * 100.0;
				info("\t%5.2f%%/%5.2f%%", te, se);
			}
			info("\n");
		}
	}
	// If user have provided reference labels, we have collected a lot of
	// statistics and we can repport global token and sequence error rate as
	// well as precision recall and f-measure for each labels.
	if (mdl->opt->check) {
		const double te = (double)terr  / tcnt * 100.0;
		const double se = (double)serr  / scnt * 100.0;
		info("    Nb sequences  : %"PRIu64"\n", scnt);
		info("    Token error   : %5.2f%%\n", te);
		info("    Sequence error: %5.2f%%\n", se);
		info("* Per label statistics\n");
		for (uint32_t y = 0; y < Y; y++) {
			const char   *lbl = qrk_id2str(lbls, y);
			const double  Rc  = (double)stat[2][y] / stat[0][y];
			const double  Pr  = (double)stat[2][y] / stat[1][y];
			const double  F1  = 2.0 * (Pr * Rc) / (Pr + Rc);
			info("    %-6s", lbl);
			info("  Pr=%.2f", Pr);
			info("  Rc=%.2f", Rc);
			info("  F1=%.2f\n", F1);
		}
	}
    
    return 1;
}